

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

void req0_ctx_reset(req0_ctx *ctx)

{
  req0_sock *prVar1;
  
  prVar1 = ctx->sock;
  nni_list_node_remove(&ctx->retry_node);
  nni_list_node_remove(&ctx->pipe_node);
  nni_list_node_remove(&ctx->send_node);
  if ((ulong)ctx->request_id != 0) {
    nni_id_remove(&prVar1->requests,(ulong)ctx->request_id);
    ctx->request_id = 0;
  }
  if (ctx->req_msg != (nni_msg *)0x0) {
    if (0 < ctx->retry) {
      nni_msg_free(ctx->req_msg);
    }
    ctx->req_msg = (nng_msg *)0x0;
  }
  if (ctx->rep_msg != (nni_msg *)0x0) {
    nni_msg_free(ctx->rep_msg);
    ctx->rep_msg = (nng_msg *)0x0;
  }
  ctx->conn_reset = false;
  return;
}

Assistant:

void
req0_ctx_reset(req0_ctx *ctx)
{
	req0_sock *s = ctx->sock;
	// Call with sock lock held!

	nni_list_node_remove(&ctx->retry_node);
	nni_list_node_remove(&ctx->pipe_node);
	nni_list_node_remove(&ctx->send_node);
	if (ctx->request_id != 0) {
		nni_id_remove(&s->requests, ctx->request_id);
		ctx->request_id = 0;
	}
	if (ctx->req_msg != NULL) {
		// Only free msg if we originally cloned it (for retries)
		if (ctx->retry > 0) {
			nni_msg_free(ctx->req_msg);
		}
		ctx->req_msg = NULL;
	}
	if (ctx->rep_msg != NULL) {
		nni_msg_free(ctx->rep_msg);
		ctx->rep_msg = NULL;
	}
	ctx->conn_reset = false;
}